

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_clear(nk_draw_list *list)

{
  nk_buffer *pnVar1;
  
  if (list != (nk_draw_list *)0x0) {
    pnVar1 = list->buffer;
    if (pnVar1 != (nk_buffer *)0x0) {
      pnVar1->allocated = 0;
      pnVar1->size = (pnVar1->memory).size;
      pnVar1->needed = 0;
      pnVar1->calls = 0;
    }
    pnVar1 = list->vertices;
    if (pnVar1 != (nk_buffer *)0x0) {
      pnVar1->allocated = 0;
      pnVar1->size = (pnVar1->memory).size;
      pnVar1->needed = 0;
      pnVar1->calls = 0;
    }
    pnVar1 = list->elements;
    if (pnVar1 != (nk_buffer *)0x0) {
      pnVar1->allocated = 0;
      pnVar1->size = (pnVar1->memory).size;
      pnVar1->needed = 0;
      pnVar1->calls = 0;
    }
    list->cmd_offset = 0;
    list->path_count = 0;
    *(undefined8 *)((long)&list->elements + 4) = 0;
    list->vertex_count = 0;
    list->cmd_count = 0;
    list->vertices = (nk_buffer *)0x0;
    list->elements = (nk_buffer *)0x0;
    list->clip_rect = nk_null_rect;
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1eae,"void nk_draw_list_clear(struct nk_draw_list *)");
}

Assistant:

NK_API void
nk_draw_list_clear(struct nk_draw_list *list)
{
    NK_ASSERT(list);
    if (!list) return;
    if (list->buffer)
        nk_buffer_clear(list->buffer);
    if (list->vertices)
        nk_buffer_clear(list->vertices);
    if (list->elements)
        nk_buffer_clear(list->elements);

    list->element_count = 0;
    list->vertex_count = 0;
    list->cmd_offset = 0;
    list->cmd_count = 0;
    list->path_count = 0;
    list->vertices = 0;
    list->elements = 0;
    list->clip_rect = nk_null_rect;
}